

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

void __thiscall
glcts::InterfaceMatchingCaseFloat::generateVarLinkFragmentShaderSrc
          (InterfaceMatchingCaseFloat *this,string *outFragSrc,GLSLVersion glslVersion,
          string *precision,TestType testMode)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *poVar3;
  ostringstream fragSrc;
  string local_1c0 [32];
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar3 = &local_1a0;
  poVar2 = std::operator<<(poVar3,pcVar1);
  std::operator<<(poVar2,"\n");
  pcVar1 = "in float var;\n";
  if (testMode != DEFAULT_PRECISION) {
    if (testMode == SET_DEFAULT_PRECISION) {
      poVar3 = &local_1a0;
      poVar2 = std::operator<<(poVar3,"precision ");
      poVar2 = std::operator<<(poVar2,(string *)precision);
      std::operator<<(poVar2," float;\n");
    }
    else {
      if (testMode != SET_PRECISION) goto LAB_00c03f5c;
      poVar3 = std::operator<<(&local_1a0,"in ");
      poVar3 = std::operator<<(poVar3,(string *)precision);
      pcVar1 = " float var;\n";
    }
  }
  std::operator<<(poVar3,pcVar1);
LAB_00c03f5c:
  std::operator<<(&local_1a0,"layout(location = 0) out mediump vec4 o_color;\n");
  std::operator<<(&local_1a0,"void main (void)\n");
  std::operator<<(&local_1a0,"{\n");
  std::operator<<(&local_1a0,"    o_color = vec4(var);\n");
  std::operator<<(&local_1a0,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)outFragSrc,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return;
}

Assistant:

void generateVarLinkFragmentShaderSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion,
										  const string& precision, TestType testMode)
	{
		std::ostringstream fragSrc;
		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		switch (testMode)
		{
		case SET_DEFAULT_PRECISION:
			fragSrc << "precision " << precision << " float;\n";
		case DEFAULT_PRECISION:
			fragSrc << "in float var;\n";
			break;
		case SET_PRECISION:
			fragSrc << "in " << precision << " float var;\n";
			break;
		}
		fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
		fragSrc << "void main (void)\n";
		fragSrc << "{\n";
		fragSrc << "    o_color = vec4(var);\n";
		fragSrc << "}\n";
		outFragSrc = fragSrc.str();
	}